

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resStrash.c
# Opt level: O2

Abc_Ntk_t * Res_WndStrash(Res_Win_t *p)

{
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 *paVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pNtk;
  char *pcVar3;
  void *pvVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Vec_Ptr_t *vPairs;
  void **ppvVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int Fill;
  int Fill_00;
  int iVar11;
  uint nCapMin;
  Vec_Ptr_t *p_00;
  long lVar12;
  int i;
  long lVar13;
  
  if (p->pNode->pNtk->ntkFunc != ABC_FUNC_AIG) {
    __assert_fail("Abc_NtkHasAig(p->pNode->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resStrash.c"
                  ,0x37,"Abc_Ntk_t *Res_WndStrash(Res_Win_t *)");
  }
  pNtk = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pcVar3 = Extra_UtilStrsav("window");
  pNtk->pName = pcVar3;
  for (iVar11 = 0; iVar11 < p->vLeaves->nSize; iVar11 = iVar11 + 1) {
    pvVar4 = Vec_PtrEntry(p->vLeaves,iVar11);
    pAVar5 = Abc_NtkCreatePi(pNtk);
    *(Abc_Obj_t **)((long)pvVar4 + 0x40) = pAVar5;
  }
  for (iVar11 = 0; iVar11 < p->vBranches->nSize; iVar11 = iVar11 + 1) {
    pvVar4 = Vec_PtrEntry(p->vBranches,iVar11);
    pAVar5 = Abc_NtkCreatePi(pNtk);
    *(Abc_Obj_t **)((long)pvVar4 + 0x40) = pAVar5;
  }
  for (iVar11 = 0; iVar11 < p->vNodes->nSize; iVar11 = iVar11 + 1) {
    pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(p->vNodes,iVar11);
    pAVar6 = Abc_ConvertAigToAig(pNtk,pAVar5);
    (pAVar5->field_6).pCopy = pAVar6;
    if (pAVar5 == p->pNode) {
      (pAVar5->field_6).pTemp = (void *)((ulong)pAVar6 ^ 1);
    }
  }
  p_00 = p->vRoots;
  iVar11 = p_00->nSize;
  vPairs = (Vec_Ptr_t *)malloc(0x10);
  iVar9 = 8;
  if (6 < iVar11 * 2 - 1U) {
    iVar9 = iVar11 * 2;
  }
  vPairs->nSize = 0;
  vPairs->nCap = iVar9;
  i = 0;
  if (iVar9 == 0) {
    ppvVar7 = (void **)0x0;
  }
  else {
    ppvVar7 = (void **)malloc((long)iVar9 << 3);
  }
  vPairs->pArray = ppvVar7;
  for (; i < iVar11; i = i + 1) {
    pvVar4 = Vec_PtrEntry(p_00,i);
    Vec_PtrPush(vPairs,*(void **)((long)pvVar4 + 0x40));
    Vec_PtrPush(vPairs,(void *)0x0);
    p_00 = p->vRoots;
    iVar11 = p_00->nSize;
  }
  pAVar2 = p->pNode->pNtk;
  if ((pAVar2->vTravIds).pArray == (int *)0x0) {
    nCapMin = pAVar2->vObjs->nSize + 500;
    Vec_IntGrow(&pAVar2->vTravIds,nCapMin);
    uVar8 = 0;
    uVar10 = 0;
    if (0 < (int)nCapMin) {
      uVar10 = (ulong)nCapMin;
    }
    for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
      (pAVar2->vTravIds).pArray[uVar8] = 0;
    }
    (pAVar2->vTravIds).nSize = nCapMin;
  }
  iVar11 = pAVar2->nTravIds;
  pAVar2->nTravIds = iVar11 + 1;
  if (iVar11 < 0x3fffffff) {
    Res_WinSweepLeafTfo_rec(p->pNode,(*(uint *)&p->pNode->field_0x14 >> 0xc) + p->nWinTfoMax);
    paVar1 = &p->pNode->field_6;
    paVar1->pTemp = (void *)((ulong)paVar1->pTemp ^ 1);
    pAVar2 = p->pNode->pNtk;
    iVar11 = pAVar2->nTravIds;
    iVar9 = p->pNode->Id;
    Vec_IntFillExtra(&pAVar2->vTravIds,iVar9 + 1,Fill);
    if ((-1 < (long)iVar9) && (iVar9 < (pAVar2->vTravIds).nSize)) {
      (pAVar2->vTravIds).pArray[iVar9] = iVar11 + -1;
      iVar11 = 0;
      while( true ) {
        if (p->vNodes->nSize <= iVar11) {
          lVar13 = 1;
          lVar12 = 0;
          while( true ) {
            if (p->vRoots->nSize <= lVar12) {
              pAVar5 = Abc_AigMiter((Abc_Aig_t *)pNtk->pManFunc,vPairs,0);
              pAVar6 = Abc_NtkCreatePo(pNtk);
              Abc_ObjAddFanin(pAVar6,pAVar5);
              free(vPairs->pArray);
              free(vPairs);
              pAVar5 = Abc_NtkCreatePo(pNtk);
              Abc_ObjAddFanin(pAVar5,(p->pNode->field_6).pCopy);
              for (lVar13 = 0; pAVar5 = p->pNode, lVar13 < (pAVar5->vFanins).nSize;
                  lVar13 = lVar13 + 1) {
                pvVar4 = pAVar5->pNtk->vObjs->pArray[(pAVar5->vFanins).pArray[lVar13]];
                pAVar5 = Abc_NtkCreatePo(pNtk);
                Abc_ObjAddFanin(pAVar5,*(Abc_Obj_t **)((long)pvVar4 + 0x40));
              }
              for (iVar11 = 0; iVar11 < p->vDivs->nSize; iVar11 = iVar11 + 1) {
                pvVar4 = Vec_PtrEntry(p->vDivs,iVar11);
                pAVar5 = Abc_NtkCreatePo(pNtk);
                Abc_ObjAddFanin(pAVar5,*(Abc_Obj_t **)((long)pvVar4 + 0x40));
              }
              Abc_NtkAddDummyPiNames(pNtk);
              Abc_NtkAddDummyPoNames(pNtk);
              iVar11 = Abc_NtkCheck(pNtk);
              if (iVar11 == 0) {
                fwrite("Res_WndStrash(): Network check has failed.\n",0x2b,1,_stdout);
              }
              return pNtk;
            }
            pvVar4 = Vec_PtrEntry(p->vRoots,(int)lVar12);
            if (vPairs->nSize <= (int)lVar13) break;
            vPairs->pArray[lVar13] = *(void **)((long)pvVar4 + 0x40);
            lVar12 = lVar12 + 1;
            lVar13 = lVar13 + 2;
          }
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(p->vNodes,iVar11);
        pAVar2 = pAVar5->pNtk;
        iVar9 = pAVar5->Id;
        Vec_IntFillExtra(&pAVar2->vTravIds,iVar9 + 1,Fill_00);
        if (((long)iVar9 < 0) || ((pAVar2->vTravIds).nSize <= iVar9)) break;
        if ((pAVar2->vTravIds).pArray[iVar9] == pAVar5->pNtk->nTravIds) {
          pAVar6 = Abc_ConvertAigToAig(pNtk,pAVar5);
          (pAVar5->field_6).pCopy = pAVar6;
        }
        iVar11 = iVar11 + 1;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Res_WndStrash( Res_Win_t * p )
{
    Vec_Ptr_t * vPairs;
    Abc_Ntk_t * pAig;
    Abc_Obj_t * pObj, * pMiter;
    int i;
    assert( Abc_NtkHasAig(p->pNode->pNtk) );
//    Abc_NtkCleanCopy( p->pNode->pNtk );
    // create the network
    pAig = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pAig->pName = Extra_UtilStrsav( "window" );
    // create the inputs
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pObj, i )
        pObj->pCopy = Abc_NtkCreatePi( pAig );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vBranches, pObj, i )
        pObj->pCopy = Abc_NtkCreatePi( pAig );
    // go through the nodes in the topological order
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vNodes, pObj, i )
    {
        pObj->pCopy = Abc_ConvertAigToAig( pAig, pObj );
        if ( pObj == p->pNode )
            pObj->pCopy = Abc_ObjNot( pObj->pCopy );
    }
    // collect the POs
    vPairs = Vec_PtrAlloc( 2 * Vec_PtrSize(p->vRoots) );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
    {
        Vec_PtrPush( vPairs, pObj->pCopy );
        Vec_PtrPush( vPairs, NULL );
    }
    // mark the TFO of the node
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    Res_WinSweepLeafTfo_rec( p->pNode, (int)p->pNode->Level + p->nWinTfoMax );
    // update strashing of the node
    p->pNode->pCopy = Abc_ObjNot( p->pNode->pCopy );
    Abc_NodeSetTravIdPrevious( p->pNode );
    // redo strashing in the TFO
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vNodes, pObj, i )
    {
        if ( Abc_NodeIsTravIdCurrent(pObj) )
            pObj->pCopy = Abc_ConvertAigToAig( pAig, pObj );
    }
    // collect the POs
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
        Vec_PtrWriteEntry( vPairs, 2 * i + 1, pObj->pCopy );
    // add the miter
    pMiter = Abc_AigMiter( (Abc_Aig_t *)pAig->pManFunc, vPairs, 0 );
    Abc_ObjAddFanin( Abc_NtkCreatePo(pAig), pMiter );
    Vec_PtrFree( vPairs );
    // add the node
    Abc_ObjAddFanin( Abc_NtkCreatePo(pAig), p->pNode->pCopy );
    // add the fanins
    Abc_ObjForEachFanin( p->pNode, pObj, i )
        Abc_ObjAddFanin( Abc_NtkCreatePo(pAig), pObj->pCopy );
    // add the divisors
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDivs, pObj, i )
        Abc_ObjAddFanin( Abc_NtkCreatePo(pAig), pObj->pCopy );
    // add the names
    Abc_NtkAddDummyPiNames( pAig );
    Abc_NtkAddDummyPoNames( pAig );
    // check the resulting network
    if ( !Abc_NtkCheck( pAig ) )
        fprintf( stdout, "Res_WndStrash(): Network check has failed.\n" );
    return pAig;
}